

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem_p.h
# Opt level: O0

qreal __thiscall QGraphicsItemPrivate::calcEffectiveOpacity(QGraphicsItemPrivate *this)

{
  ulong uVar1;
  uint uVar2;
  QGraphicsItemPrivate *pQVar3;
  long in_RDI;
  int parentFlags;
  int myFlags;
  QGraphicsItem *p;
  qreal o;
  QGraphicsItem *local_18;
  double local_10;
  
  local_10 = *(double *)(in_RDI + 0x80);
  local_18 = *(QGraphicsItem **)(in_RDI + 0x90);
  uVar2 = (uint)((ulong)*(undefined8 *)(in_RDI + 0x160) >> 0x20);
  while( true ) {
    if (local_18 == (QGraphicsItem *)0x0) {
      return local_10;
    }
    pQVar3 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->(&local_18->d_ptr);
    uVar1 = *(ulong *)&pQVar3->field_0x160;
    if ((uVar2 & 0x40) != 0) break;
    if ((uVar1 & 0x8000000000) != 0) {
      return local_10;
    }
    pQVar3 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->(&local_18->d_ptr);
    local_10 = pQVar3->opacity * local_10;
    pQVar3 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->(&local_18->d_ptr);
    local_18 = pQVar3->parent;
    uVar2 = (uint)(uVar1 >> 0x20);
  }
  return local_10;
}

Assistant:

inline qreal calcEffectiveOpacity() const
    {
        qreal o = opacity;
        QGraphicsItem *p = parent;
        int myFlags = flags;
        while (p) {
            int parentFlags = p->d_ptr->flags;

            // If I have a parent, and I don't ignore my parent's opacity, and my
            // parent propagates to me, then combine my local opacity with my parent's
            // effective opacity into my effective opacity.
            if ((myFlags & QGraphicsItem::ItemIgnoresParentOpacity)
                || (parentFlags & QGraphicsItem::ItemDoesntPropagateOpacityToChildren)) {
                break;
            }

            o *= p->d_ptr->opacity;
            p = p->d_ptr->parent;
            myFlags = parentFlags;
        }
        return o;
    }